

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O0

MMDB_entry_data_list_s * test_utf8_string_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_s entry_data;
  char *got;
  undefined8 uVar2;
  undefined8 in_stack_ffffffffffffffc8;
  char expect [19];
  char *utf8_string;
  MMDB_entry_data_list_s *value;
  MMDB_entry_data_list_s *entry_data_list_local;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x139,(pMVar1->entry_data).type,"==",2,"\'utf8_string\' key\'s value is a string",0
               );
  uVar2 = *(undefined8 *)&pMVar1->entry_data;
  entry_data.data_size = (int)in_stack_ffffffffffffffc8;
  entry_data.type = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  entry_data._0_40_ = *(undefined1 (*) [40])&(pMVar1->entry_data).field_0x8;
  got = dup_entry_string_or_bail(entry_data);
  is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0x150,got,&stack0xffffffffffffffc8,"got expected value for utf8_string key",0,uVar2);
  free(got);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_utf8_string_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "'utf8_string' key's value is a string");
    char *utf8_string = dup_entry_string_or_bail(value->entry_data);
    // This is hex for "unicode! ☯ - ♫" as bytes
    char expect[19] = {0x75,
                       0x6e,
                       0x69,
                       0x63,
                       0x6f,
                       0x64,
                       0x65,
                       0x21,
                       0x20,
                       (char)0xe2,
                       (char)0x98,
                       (char)0xaf,
                       0x20,
                       0x2d,
                       0x20,
                       (char)0xe2,
                       (char)0x99,
                       (char)0xab,
                       0x00};

    is(utf8_string, expect, "got expected value for utf8_string key");

    free(utf8_string);

    return entry_data_list;
}